

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::yml::detail::ReferenceResolver::count_anchors_and_refs(ReferenceResolver *this,size_t n)

{
  NodeData *pNVar1;
  Tree *this_00;
  size_t sVar2;
  size_t n_00;
  ReferenceResolver *in_RSI;
  undefined8 *in_RDI;
  size_t ch;
  size_t c;
  bool local_81;
  size_t local_80;
  long lVar3;
  ReferenceResolver *i;
  Tree *this_01;
  
  lVar3 = 0;
  this_01 = (Tree *)*in_RDI;
  i = in_RSI;
  pNVar1 = Tree::_p(this_01,(size_t)in_RSI);
  lVar3 = (ulong)(((pNVar1->m_type).type & (KEYANCH|KEY)) == (KEYANCH|KEY)) + lVar3;
  this_00 = (Tree *)Tree::_p(this_01,(size_t)i);
  local_81 = false;
  if ((((NodeType *)&this_00->m_buf)->type & VALANCH) != NOTYPE) {
    local_81 = (((NodeType *)&this_00->m_buf)->type & (SEQ|MAP|VAL)) != NOTYPE;
  }
  lVar3 = (ulong)local_81 + lVar3;
  pNVar1 = Tree::_p(this_01,(size_t)i);
  lVar3 = (ulong)(((pNVar1->m_type).type & KEYREF) != NOTYPE) + lVar3;
  pNVar1 = Tree::_p(this_01,(size_t)i);
  n_00 = (ulong)(((pNVar1->m_type).type & VALREF) != NOTYPE) + lVar3;
  local_80 = Tree::first_child(this_00,(size_t)in_RDI);
  while (local_80 != 0xffffffffffffffff) {
    sVar2 = count_anchors_and_refs(in_RSI,n_00);
    n_00 = sVar2 + n_00;
    local_80 = Tree::next_sibling(this_00,(size_t)in_RDI);
  }
  return n_00;
}

Assistant:

size_t count_anchors_and_refs(size_t n)
    {
        size_t c = 0;
        c += t->has_key_anchor(n);
        c += t->has_val_anchor(n);
        c += t->is_key_ref(n);
        c += t->is_val_ref(n);
        for(size_t ch = t->first_child(n); ch != NONE; ch = t->next_sibling(ch))
            c += count_anchors_and_refs(ch);
        return c;
    }